

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O0

void __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
::initPrograms(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
               *this,SourceCollections *programCollection)

{
  ShaderType shaderType_;
  const_iterator this_00;
  bool bVar1;
  pointer ppVar2;
  ProgramSources *this_01;
  ShaderSourceProvider *this_02;
  char *pcVar3;
  string local_a8;
  ShaderSource local_88;
  allocator<char> local_49;
  string local_48;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  SourceCollections *programCollection_local;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
  *this_local;
  
  i._M_node = (_Base_ptr)programCollection;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
       ::begin((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&this->m_testSpec);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
         ::end((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&this->m_testSpec);
    bVar1 = std::operator!=(&local_20,&local_28);
    this_00 = i;
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_glu::ShaderType,_const_char_*>_>::
             operator->(&local_20);
    pcVar3 = ppVar2->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar3,&local_49);
    this_01 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        ((ProgramCollection<glu::ProgramSources> *)this_00._M_node,&local_48);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_glu::ShaderType,_const_char_*>_>::
             operator->(&local_20);
    shaderType_ = ppVar2->first;
    pcVar3 = (char *)(ulong)shaderType_;
    this_02 = (ShaderSourceProvider *)
              tcu::TestContext::getArchive
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_glu::ShaderType,_const_char_*>_>::
             operator->(&local_20);
    ShaderSourceProvider::getSource_abi_cxx11_(&local_a8,this_02,(Archive *)ppVar2->second,pcVar3);
    glu::ShaderSource::ShaderSource(&local_88,shaderType_,&local_a8);
    glu::ProgramSources::operator<<(this_01,&local_88);
    glu::ShaderSource::~ShaderSource(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    std::_Rb_tree_const_iterator<std::pair<const_glu::ShaderType,_const_char_*>_>::operator++
              (&local_20);
  }
  return;
}

Assistant:

virtual void initPrograms (vk::SourceCollections& programCollection) const
	{
		for (ShaderMap::const_iterator i = m_testSpec.shaders.begin(); i != m_testSpec.shaders.end(); ++i)
		{
			programCollection.glslSources.add(i->second) <<
				glu::ShaderSource(i->first, ShaderSourceProvider::getSource(m_testCtx.getArchive(), i->second));
		}
	}